

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupWiningStateTest::~TEST_GROUP_CppUTestGroupWiningStateTest
          (TEST_GROUP_CppUTestGroupWiningStateTest *this)

{
  TEST_GROUP_CppUTestGroupWiningStateTest *this_local;
  
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupWiningStateTest_0025b8f0;
  mahjong::WiningState::~WiningState(&this->s);
  mahjong::PlayerHand::~PlayerHand(&this->h);
  Utest::~Utest(&this->super_Utest);
  return;
}

Assistant:

TEST_GROUP(WiningStateTest)
{
	PlayerHand h;
	WiningState s;
	DoubligFactorCounter c { h, s };

	void addPair(Tile tile)
	{
		h.add(tile);
		h.add(tile);
	}

	void addTriplet(Tile tile)
	{
		h.add(tile);
		h.add(tile);
		h.add(tile);
	}

	void addSequence(Tile tile)
	{
		assert(int(tile) % 10 <= 7);

		h.add(tile);
		h.add(NextTile()(h.lastTile()));
		h.add(NextTile()(h.lastTile()));
	}

	void addNoWiningHand(bool is_claim = false)
	{
		addPair(Tile::OneOfBamboos);

		addSequence(Tile::TwoOfBamboos);
		addSequence(Tile::ThreeOfCharacters);

		if (is_claim)
		{
			addTriplet(Tile::SixOfCircles);
			h.bindTriplet({
				Tile::SixOfCircles,
				Tile::SixOfCircles,
				Tile::SixOfCircles
			});
		}

		addSequence(Tile::SevenOfCharacters);
	}

	void selfDrawn(SelfDrawnSituation situation = {})
	{
		s.selfDrawn(situation);
	}

	void winByDiscard(WinByDiscardSituation situation = {})
	{
		s.winByDiscard(situation);
	}
}